

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O0

void OPNWriteMode(FM_OPN *OPN,int r,int v)

{
  FM_CH *CH_00;
  FM_CH *CH;
  UINT8 c;
  int v_local;
  int r_local;
  FM_OPN *OPN_local;
  
  switch(r) {
  case 0x21:
    break;
  case 0x22:
    if ((v & 8U) == 0) {
      OPN->lfo_timer_overflow = 0;
      OPN->lfo_timer = 0;
      OPN->lfo_cnt = '\0';
      OPN->LFO_PM = 0;
      OPN->LFO_AM = 0x7e;
    }
    else {
      OPN->lfo_timer_overflow = lfo_samples_per_step[(int)(v & 7)] << 0x18;
    }
    break;
  case 0x24:
    (OPN->ST).TA = (OPN->ST).TA & 3U | v << 2;
    break;
  case 0x25:
    (OPN->ST).TA = (OPN->ST).TA & 0x3fcU | v & 3U;
    break;
  case 0x26:
    (OPN->ST).TB = (byte)v;
    break;
  case 0x27:
    set_timers(OPN,&OPN->ST,(OPN->ST).param,v);
    break;
  case 0x28:
    CH._7_1_ = (byte)v & 3;
    if (CH._7_1_ != 3) {
      if (((v & 4U) != 0) && ((OPN->type & 4) != 0)) {
        CH._7_1_ = CH._7_1_ + 3;
      }
      CH_00 = OPN->P_CH + CH._7_1_;
      if ((v & 0x10U) == 0) {
        FM_KEYOFF(OPN,CH_00,0);
      }
      else {
        FM_KEYON(OPN,CH_00,0);
      }
      if ((v & 0x20U) == 0) {
        FM_KEYOFF(OPN,CH_00,2);
      }
      else {
        FM_KEYON(OPN,CH_00,2);
      }
      if ((v & 0x40U) == 0) {
        FM_KEYOFF(OPN,CH_00,1);
      }
      else {
        FM_KEYON(OPN,CH_00,1);
      }
      if ((v & 0x80U) == 0) {
        FM_KEYOFF(OPN,CH_00,3);
      }
      else {
        FM_KEYON(OPN,CH_00,3);
      }
    }
  }
  return;
}

Assistant:

static void OPNWriteMode(FM_OPN *OPN, int r, int v)
{
	UINT8 c;
	FM_CH *CH;

	switch(r)
	{
	case 0x21:	/* Test */
		break;
	case 0x22:	/* LFO FREQ (YM2608/YM2610/YM2610B/YM2612) */
		if (v&8) /* LFO enabled ? */
		{
			#if 0
			if (!OPN->lfo_timer_overflow)
			{
				/* restart LFO */
				OPN->lfo_cnt   = 0;
				OPN->lfo_timer = 0;
				OPN->LFO_AM    = 0;
				OPN->LFO_PM    = 0;
			}
			#endif

			OPN->lfo_timer_overflow = lfo_samples_per_step[v&7] << LFO_SH;
		}
		else
		{
			/* Valley Bell: Ported from Genesis Plus GX 1.71
				hold LFO waveform in reset state */
			OPN->lfo_timer_overflow = 0;
			OPN->lfo_timer = 0;
			OPN->lfo_cnt = 0;


			OPN->LFO_PM = 0;
			OPN->LFO_AM = 126;
			/* OPN->lfo_timer_overflow = 0; */
		}
		break;
	case 0x24:	/* timer A High 8*/
		OPN->ST.TA = (OPN->ST.TA & 0x03)|(((int)v)<<2);
		break;
	case 0x25:	/* timer A Low 2*/
		OPN->ST.TA = (OPN->ST.TA & 0x3fc)|(v&3);
		break;
	case 0x26:	/* timer B */
		OPN->ST.TB = (UINT8)v;
		break;
	case 0x27:	/* mode, timer control */
		set_timers( OPN, &(OPN->ST),OPN->ST.param,v );
		break;
	case 0x28:	/* key on / off */
		c = v & 0x03;
		if( c == 3 ) break;
		if( (v&0x04) && (OPN->type & TYPE_6CH) ) c+=3;
		CH = OPN->P_CH;
		CH = &CH[c];
		if(v&0x10) FM_KEYON(OPN,CH,SLOT1); else FM_KEYOFF(OPN,CH,SLOT1);
		if(v&0x20) FM_KEYON(OPN,CH,SLOT2); else FM_KEYOFF(OPN,CH,SLOT2);
		if(v&0x40) FM_KEYON(OPN,CH,SLOT3); else FM_KEYOFF(OPN,CH,SLOT3);
		if(v&0x80) FM_KEYON(OPN,CH,SLOT4); else FM_KEYOFF(OPN,CH,SLOT4);
		break;
	}
}